

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  undefined8 uVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  difference_type __d;
  uint uVar7;
  int iVar8;
  
  uVar1 = *(undefined8 *)(this + 0x10);
  lVar2 = *state;
  if (*(int *)(this + 0xc) == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      cVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
      if (cVar3 == '\0') break;
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(uint *)(this + 0xc));
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
       )0x1) {
    lVar4 = (ulong)(state[4] != lVar2) + lVar2;
    lVar5 = lVar4;
    if (uVar7 < *(uint *)(this + 0xc)) {
      lVar5 = *state;
    }
    if (uVar7 != 0) {
      lVar4 = lVar5;
    }
    state[0x12] = lVar4;
  }
  if (uVar7 < *(uint *)(this + 8)) {
LAB_0012c8f7:
    *state = lVar2;
    bVar6 = false;
  }
  else {
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    bVar6 = true;
    if (cVar3 == '\0') {
      iVar8 = uVar7 + 1;
      do {
        iVar8 = iVar8 + -1;
        if (iVar8 == *(int *)(this + 8)) goto LAB_0012c8f7;
        *state = *state + (long)-(int)uVar1;
        cVar3 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar3 == '\0');
    }
  }
  return bVar6;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }